

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

FDecalBase * FDecalLib::ScanTreeForName(char *name,FDecalBase *root)

{
  NameEntry *pNVar1;
  uint uVar2;
  
  pNVar1 = FName::NameData.NameArray;
  while( true ) {
    if (root == (FDecalBase *)0x0) {
      return (FDecalBase *)0x0;
    }
    uVar2 = strcasecmp(name,pNVar1[(root->Name).Index].Text);
    if (uVar2 == 0) break;
    root = (&root->Left)[~uVar2 >> 0x1f];
  }
  return root;
}

Assistant:

FDecalBase *FDecalLib::ScanTreeForName (const char *name, FDecalBase *root)
{
	while (root != NULL)
	{
		int lexx = stricmp (name, root->Name);
		if (lexx == 0)
		{
			break;
		}
		else if (lexx < 0)
		{
			root = root->Left;
		}
		else
		{
			root = root->Right;
		}
	}
	return root;
}